

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O3

void printCPSIFlag(MCInst *MI,uint OpNum,SStream *O)

{
  x86_reg xVar1;
  MCOperand *op;
  uint uVar3;
  undefined4 in_register_00000034;
  char *s;
  bool bVar4;
  int64_t iVar2;
  
  op = MCInst_getOperand(MI,1);
  iVar2 = MCOperand_getImm(op);
  xVar1 = (x86_reg)iVar2;
  uVar3 = 2;
  do {
    if ((xVar1 >> (uVar3 & 0x1f) & 1) != 0) {
      s = anon_var_dwarf_e9e52 + 0x11;
      if (uVar3 < 3) {
        s = &DAT_001d5c64 + *(int *)(&UNK_001d5c60 + (long)(1 << ((byte)uVar3 & 0x1f)) * 4);
      }
      SStream_concat0((SStream *)CONCAT44(in_register_00000034,OpNum),s);
    }
    bVar4 = uVar3 != 0;
    uVar3 = uVar3 - 1;
  } while (bVar4);
  if (xVar1 == X86_REG_INVALID) {
    SStream_concat0((SStream *)CONCAT44(in_register_00000034,OpNum),"none");
    xVar1 = X86_REG_DL;
  }
  if (MI->csh->detail != CS_OPT_OFF) {
    (MI->flat_insn->detail->field_6).x86.sib_index = xVar1;
  }
  return;
}

Assistant:

static void printCPSIFlag(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNum);
	unsigned IFlags = (unsigned int)MCOperand_getImm(Op);
	int i;

	for (i = 2; i >= 0; --i)
		if (IFlags & (1 << i)) {
			SStream_concat0(O, ARM_PROC_IFlagsToString(1 << i));
		}

	if (IFlags == 0) {
		SStream_concat0(O, "none");
		IFlags = ARM_CPSFLAG_NONE;
	}

	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.cps_flag = IFlags;
	}
}